

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::DeepTiledOutputFile::Data::Data(Data *this,int numThreads)

{
  reference ppTVar1;
  long in_RDI;
  size_type sVar2;
  vector<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
  *this_00;
  size_t i;
  DeepFrameBuffer *in_stack_ffffffffffffff90;
  long lVar3;
  LineOrder in_stack_ffffffffffffffc0;
  LevelMode r;
  V2f *in_stack_ffffffffffffffc8;
  ulong uVar4;
  ulong __n;
  float in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  LevelMode in_stack_ffffffffffffffdc;
  Header *in_stack_ffffffffffffffe0;
  Vec2<float> local_14 [2];
  
  lVar3 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(local_14,0.0,0.0);
  r = ONE_LEVEL;
  Header::Header(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,0.0,in_stack_ffffffffffffffc0,
                 (Compression)((ulong)lVar3 >> 0x20));
  TileDescription::TileDescription((TileDescription *)(lVar3 + 0x40),0x20,0x20,r,r);
  DeepFrameBuffer::DeepFrameBuffer(in_stack_ffffffffffffff90);
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  *(undefined8 *)(in_RDI + 0xe8) = 0;
  TileOffsets::TileOffsets
            ((TileOffsets *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
             in_stack_ffffffffffffffd8,(int)in_stack_ffffffffffffffd4,
             (int *)in_stack_ffffffffffffffc8,(int *)CONCAT44(r,in_stack_ffffffffffffffc0));
  std::
  vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
  ::vector((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
            *)0x1b7243);
  sVar2 = in_RDI + 0x138;
  std::
  vector<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
  ::vector((vector<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
            *)0x1b7259);
  *(undefined8 *)(in_RDI + 0x150) = 0;
  this_00 = (vector<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
             *)(in_RDI + 0x158);
  std::
  map<Imf_3_2::(anonymous_namespace)::TileCoord,_Imf_3_2::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_2::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_2::(anonymous_namespace)::TileCoord,_Imf_3_2::(anonymous_namespace)::BufferedTile_*>_>_>
  ::map((map<Imf_3_2::(anonymous_namespace)::TileCoord,_Imf_3_2::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_2::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_2::(anonymous_namespace)::TileCoord,_Imf_3_2::(anonymous_namespace)::BufferedTile_*>_>_>
         *)0x1b727a);
  anon_unknown_7::TileCoord::TileCoord((TileCoord *)(in_RDI + 0x188),0,0,0,0);
  *(undefined4 *)(in_RDI + 0x198) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x1c0) = 0;
  *(undefined1 *)(in_RDI + 0x1c8) = 1;
  std::max<int>((int *)&stack0xffffffffffffffd8,(int *)&stack0xffffffffffffffd4);
  std::
  vector<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
  ::resize(this_00,sVar2);
  uVar4 = 0;
  while( true ) {
    __n = uVar4;
    sVar2 = std::
            vector<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
            ::size((vector<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                    *)(in_RDI + 0x138));
    if (sVar2 <= uVar4) break;
    ppTVar1 = std::
              vector<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[]((vector<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                            *)(in_RDI + 0x138),__n);
    *ppTVar1 = (value_type)0x0;
    uVar4 = __n + 1;
  }
  return;
}

Assistant:

DeepTiledOutputFile::Data::Data (int numThreads)
    : numXTiles (0)
    , numYTiles (0)
    , tileOffsetsPosition (0)
    , partNumber (-1)
    , _streamData (NULL)
    , _deleteStream (true)
{
    //
    // We need at least one tileBuffer, but if threading is used,
    // to keep n threads busy we need 2*n tileBuffers
    //

    tileBuffers.resize (max (1, 2 * numThreads));
    for (size_t i = 0; i < tileBuffers.size (); i++)
        tileBuffers[i] = 0;
}